

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

void rshift(Bigint *b,int k)

{
  ULong *pUVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  sbyte sVar6;
  int iVar7;
  ULong *pUVar8;
  uint *puVar9;
  uint uVar10;
  
  pUVar1 = b->x;
  uVar5 = (uint)k >> 5;
  uVar3 = b->wds;
  pUVar8 = pUVar1;
  if ((int)uVar5 < (int)uVar3) {
    if ((k & 0x1fU) == 0) {
      for (; puVar2 = (uint *)((long)pUVar8 + (ulong)(uVar5 << 2)), puVar2 < pUVar1 + uVar3;
          pUVar8 = pUVar8 + 1) {
        *pUVar8 = *puVar2;
      }
    }
    else {
      sVar6 = (sbyte)(k & 0x1fU);
      while( true ) {
        puVar2 = (uint *)((long)pUVar8 + (ulong)(uVar5 << 2));
        puVar9 = puVar2 + 1;
        uVar4 = *puVar2;
        uVar10 = uVar4 >> sVar6;
        if (pUVar1 + uVar3 <= puVar9) break;
        *pUVar8 = *puVar9 << (0x20U - sVar6 & 0x1f) | uVar10;
        pUVar8 = pUVar8 + 1;
      }
      *pUVar8 = uVar10;
      pUVar8 = pUVar8 + (uVar4 >> sVar6 != 0);
    }
  }
  iVar7 = (int)((ulong)((long)pUVar8 - (long)pUVar1) >> 2);
  b->wds = iVar7;
  if (iVar7 == 0) {
    *pUVar1 = 0;
  }
  return;
}

Assistant:

static void
rshift(Bigint *b, int k)
{
	ULong *x, *x1, *xe, y;
	int n;

	x = x1 = b->x;
	n = k >> kshift;
	if (n < b->wds) {
		xe = x + b->wds;
		x += n;
		if (k &= kmask) {
			n = 32 - k;
			y = *x++ >> k;
			while(x < xe) {
				*x1++ = (y | (*x << n)) & 0xffffffff;
				y = *x++ >> k;
				}
			if ((*x1 = y) !=0)
				x1++;
			}
		else
			while(x < xe)
				*x1++ = *x++;
		}
	if ((b->wds = x1 - b->x) == 0)
		b->x[0] = 0;
	}